

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitm.c
# Opt level: O1

int fightm(monst *mtmp)

{
  boolean bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  uint uVar5;
  monst *mdef;
  monst *pmVar6;
  byte bVar7;
  
  iVar2 = resist(mtmp,'\x04',0,0);
  if ((iVar2 == 0) && ((u.ustuck != mtmp || (bVar1 = itsstuck(mtmp), bVar1 == '\0')))) {
    if (level->monlist != (monst *)0x0) {
      bVar7 = u.ustuck == mtmp & u._1052_1_;
      mdef = level->monlist;
      do {
        pmVar6 = mdef->nmon;
        if (pmVar6 == mtmp) {
          pmVar6 = mtmp->nmon;
        }
        if (((mdef != mtmp) && (0 < mdef->mhp)) &&
           (bVar1 = monnear(mtmp,(int)mdef->mx,(int)mdef->my), bVar1 != '\0')) {
          if (((u._1052_1_ & 1) == 0) && (u.ustuck == mtmp)) {
            uVar3 = mt_random();
            if ((uVar3 & 3) != 0) {
              return 0;
            }
            pcVar4 = Monnam(mtmp);
            pline("%s releases you!",pcVar4);
            u.ustuck = (monst *)0x0;
            u._1052_1_ = u._1052_1_ & 0x7f;
          }
          bhitpos.x = mdef->mx;
          bhitpos.y = mdef->my;
          notonhead = '\0';
          uVar3 = mattackm(mtmp,mdef);
          if (bVar7 != 0 || (uVar3 >> 2 & 1) != 0) {
            return uVar3 >> 2 & 1;
          }
          uVar5 = uVar3 & 1;
          if ((uVar3 & 3) != 1) {
            return uVar5;
          }
          uVar3 = mt_random();
          if ((uVar3 & 3) == 0) {
            return uVar5;
          }
          if (mdef->movement < 0xc) {
            return uVar5;
          }
          mdef->movement = mdef->movement + -0xc;
          notonhead = '\0';
          mattackm(mdef,mtmp);
          return uVar5;
        }
        mdef = pmVar6;
      } while (pmVar6 != (monst *)0x0);
    }
  }
  return 0;
}

Assistant:

int fightm(struct monst *mtmp)		/* have monsters fight each other */
{
	struct monst *mon, *nmon;
	int result, has_u_swallowed;

	/* perhaps the monster will resist Conflict */
	if (resist(mtmp, RING_CLASS, 0, 0))
	    return 0;

	if (u.ustuck == mtmp) {
	    /* perhaps we're holding it... */
	    if (itsstuck(mtmp))
		return 0;
	}
	has_u_swallowed = (u.uswallow && (mtmp == u.ustuck));

	for (mon = level->monlist; mon; mon = nmon) {
	    nmon = mon->nmon;
	    if (nmon == mtmp) nmon = mtmp->nmon;
	    /* Be careful to ignore monsters that are already dead, since we
	     * might be calling this before we've cleaned them up.  This can
	     * happen if the monster attacked a cockatrice bare-handedly, for
	     * instance.
	     */
	    if (mon != mtmp && !DEADMONSTER(mon)) {
		if (monnear(mtmp,mon->mx,mon->my)) {
		    if (!u.uswallow && (mtmp == u.ustuck)) {
			if (!rn2(4)) {
			    pline("%s releases you!", Monnam(mtmp));
			    u.ustuck = 0;
			    u.uwilldrown = 0;
			} else
			    break;
		    }

		    /* mtmp can be killed */
		    bhitpos.x = mon->mx;
		    bhitpos.y = mon->my;
		    notonhead = 0;
		    result = mattackm(mtmp,mon);

		    if (result & MM_AGR_DIED) return 1;	/* mtmp died */
		    /*
		     *  If mtmp has the hero swallowed, lie and say there
		     *  was no attack (this allows mtmp to digest the hero).
		     */
		    if (has_u_swallowed) return 0;

		    /* Allow attacked monsters a chance to hit back. Primarily
		     * to allow monsters that resist conflict to respond.
		     */
		    if ((result & MM_HIT) && !(result & MM_DEF_DIED) &&
			rn2(4) && mon->movement >= NORMAL_SPEED) {
			mon->movement -= NORMAL_SPEED;
			notonhead = 0;
			mattackm(mon, mtmp);	/* return attack */
		    }

		    return (result & MM_HIT) ? 1 : 0;
		}
	    }
	}
	return 0;
}